

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestOStreamDouble_Test::TestBody
          (PriceFieldTest_TestOStreamDouble_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  char *message;
  AssertHelper local_200;
  Message local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  stringstream local_1b0 [8];
  stringstream ss;
  undefined1 local_1a0 [376];
  PriceField local_28 [8];
  PriceField field;
  double value;
  PriceFieldTest_TestOStreamDouble_Test *this_local;
  
  bidfx_public_api::price::PriceField::PriceField(local_28,200.47229);
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = (ostream *)std::ostream::operator<<(local_1a0,std::fixed);
  gtest_ar.message_.ptr_._0_4_ = std::setprecision(6);
  poVar2 = std::operator<<(poVar2,gtest_ar.message_.ptr_._0_4_);
  bidfx_public_api::price::operator<<(poVar2,local_28);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((EqHelper<false> *)local_1d0,"\"200.472290\"","ss.str()",(char (*) [11])"200.472290",
             &local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x5a,message);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  bidfx_public_api::price::PriceField::~PriceField(local_28);
  return;
}

Assistant:

TEST(PriceFieldTest, TestOStreamDouble)
{
    double value = 200.47229;
    PriceField field = PriceField(value);
    std::stringstream ss;
    ss << std::fixed << std::setprecision(6) << field;
    EXPECT_EQ("200.472290", ss.str());
}